

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postproc_filters_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::PostprocFiltersTestLarge_MD5Match_Test::
~PostprocFiltersTestLarge_MD5Match_Test(PostprocFiltersTestLarge_MD5Match_Test *this)

{
  PostprocFiltersTestLarge_MD5Match_Test *in_stack_00000010;
  
  anon_unknown.dwarf_c82961::PostprocFiltersTestLarge_MD5Match_Test::
  ~PostprocFiltersTestLarge_MD5Match_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(PostprocFiltersTestLarge, MD5Match) { DoTest(); }